

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int aRet;
  int extraout_EAX;
  
  aRet = sqlite3_bind_int((this->mStmtPtr).mpStmt,__fd,(int)__addr);
  check(this,aRet);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const int aIndex, const int aValue)
{
    const int ret = sqlite3_bind_int(mStmtPtr, aIndex, aValue);
    check(ret);
}